

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvalidator.c
# Opt level: O0

void OutputWarning(int ErrCode,tchar_t *ErrString,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined1 local_438 [8];
  va_list Args;
  tchar_t local_418 [8];
  tchar_t Buffer [1024];
  tchar_t *ErrString_local;
  int ErrCode_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (Warnings != 0) {
    Args[0].overflow_arg_area = local_4e8;
    Args[0]._0_8_ = &stack0x00000008;
    local_438._4_4_ = 0x30;
    local_438._0_4_ = 0x10;
    local_4d8 = in_RDX;
    local_4d0 = in_RCX;
    local_4c8 = in_R8;
    local_4c0 = in_R9;
    Buffer._1016_8_ = ErrString;
    vstprintf_s(local_418,0x400,ErrString,(__va_list_tag *)local_438);
    TextPrintf((textwriter_conflict *)StdErr,"\rWRN%03X: %s\r\n",(ulong)(uint)ErrCode,local_418);
    if (QuickExit != 0) {
      exit(-ErrCode);
    }
  }
  return;
}

Assistant:

static void OutputWarning(int ErrCode, const tchar_t *ErrString, ...)
{
    if (Warnings)
    {
        tchar_t Buffer[MAXLINE];
        va_list Args;
        va_start(Args,ErrString);
        vstprintf_s(Buffer,TSIZEOF(Buffer), ErrString, Args);
        va_end(Args);
        TextPrintf(StdErr,T("\rWRN%03X: %s\r\n"),ErrCode,Buffer);
        if (QuickExit)
            exit(-ErrCode);
    }
}